

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcFault.c
# Opt level: O0

void Cnf_AddSorder(sat_solver *p,int *pVars,int i,int k,int *pnVars)

{
  int iVar;
  int iVar_00;
  int iVar2;
  int iVar1;
  int *pnVars_local;
  int k_local;
  int i_local;
  int *pVars_local;
  sat_solver *p_local;
  
  iVar = *pnVars;
  *pnVars = iVar + 1;
  iVar_00 = *pnVars;
  *pnVars = iVar_00 + 1;
  sat_solver_add_and(p,iVar,pVars[i],pVars[k],1,1,1);
  sat_solver_add_and(p,iVar_00,pVars[i],pVars[k],0,0,0);
  pVars[i] = iVar;
  pVars[k] = iVar_00;
  return;
}

Assistant:

static inline void Cnf_AddSorder( sat_solver * p, int * pVars, int i, int k, int * pnVars )
{
    int iVar1 = (*pnVars)++;
    int iVar2 = (*pnVars)++;
    sat_solver_add_and( p, iVar1, pVars[i], pVars[k], 1, 1, 1 );
    sat_solver_add_and( p, iVar2, pVars[i], pVars[k], 0, 0, 0 );
    pVars[i] = iVar1;
    pVars[k] = iVar2;
}